

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_sample.cpp
# Opt level: O0

void duckdb::DuckDBTableSampleFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  DuckDBTableSampleFunctionData *pDVar1;
  NotImplementedException *this;
  DuckDBTableSampleOperatorData *state;
  DuckDBTableSampleFunctionData *bind_data;
  string *in_stack_ffffffffffffff78;
  CatalogEntry *in_stack_ffffffffffffff80;
  DataChunk *in_stack_ffffffffffffffa8;
  TableCatalogEntry *in_stack_ffffffffffffffb0;
  DuckDBTableSampleOperatorData *in_stack_ffffffffffffffb8;
  ClientContext *in_stack_ffffffffffffffc0;
  
  optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)in_stack_ffffffffffffff80);
  pDVar1 = FunctionData::Cast<duckdb::DuckDBTableSampleFunctionData>
                     ((FunctionData *)in_stack_ffffffffffffff80);
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)in_stack_ffffffffffffff80);
  GlobalTableFunctionState::Cast<duckdb::DuckDBTableSampleOperatorData>
            ((GlobalTableFunctionState *)in_stack_ffffffffffffff80);
  if (pDVar1->entry->type == TABLE_ENTRY) {
    CatalogEntry::Cast<duckdb::TableCatalogEntry>(in_stack_ffffffffffffff80);
    DuckDBTableSampleTable
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    return;
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb8,"Unimplemented catalog type for pragma_table_sample"
             ,(allocator *)&stack0xffffffffffffffb7);
  NotImplementedException::NotImplementedException(this,in_stack_ffffffffffffff78);
  __cxa_throw(this,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

static void DuckDBTableSampleFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<DuckDBTableSampleFunctionData>();
	auto &state = data_p.global_state->Cast<DuckDBTableSampleOperatorData>();
	switch (bind_data.entry.type) {
	case CatalogType::TABLE_ENTRY:
		DuckDBTableSampleTable(context, state, bind_data.entry.Cast<TableCatalogEntry>(), output);
		break;
	default:
		throw NotImplementedException("Unimplemented catalog type for pragma_table_sample");
	}
}